

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otsu_method.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  allocator local_a1;
  string path;
  BMPImg grayscale_img;
  
  if (argc == 2) {
    grayscale_img.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    grayscale_img.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    grayscale_img.color_palette.
    super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    grayscale_img.pixel_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    grayscale_img.color_palette.
    super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    grayscale_img.color_palette.
    super__Vector_base<simpleBMP::PaletteItem,_std::allocator<simpleBMP::PaletteItem>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    grayscale_img.channel = 1;
    std::__cxx11::string::string((string *)&path,argv[1],&local_a1);
    simpleBMP::BMPImg::LoadImage<void>(&grayscale_img,&path);
    std::__cxx11::string::~string((string *)&path);
    if (grayscale_img.info_header.biBitCount != 8) {
      __assert_fail("grayscale_img.info_header.biBitCount == 8 && \"Only support 8-bit gray-scale image\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/edimetia3d[P]simpleBMP/sample/otsu_method.cpp"
                    ,0x42,"int main(int, char **)");
    }
    Otsu(&grayscale_img);
    std::__cxx11::string::string((string *)&path,argv[1],&local_a1);
    std::__cxx11::string::append((char *)&path);
    simpleBMP::BMPImg::SaveImage<void>(&grayscale_img,&path);
    std::__cxx11::string::~string((string *)&path);
    simpleBMP::BMPImg::~BMPImg(&grayscale_img);
    iVar1 = 0;
  }
  else {
    fprintf(_stderr,"Usage: %s <path_to_input_image>\n",*argv);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    fprintf(stderr, "Usage: %s <path_to_input_image>\n", argv[0]);
    return 1;
  }
  simpleBMP::BMPImg grayscale_img;
  grayscale_img.LoadImage(argv[1]);
  assert(grayscale_img.info_header.biBitCount == 8 &&
         "Only support 8-bit gray-scale image");
  Otsu(&grayscale_img);

  std::string path = argv[1];
  path += ".otsu.bmp";
  grayscale_img.SaveImage(path);
  return 0;
}